

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall cmMakefile::AddNewTarget(cmMakefile *this,TargetType type,string *name)

{
  cmGlobalGenerator *this_00;
  pointer ppVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>,_bool>
  pVar2;
  cmStateSnapshot local_448;
  cmStateDirectory local_430;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_408;
  undefined1 local_400;
  cmTarget local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  local_220;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_38;
  undefined1 local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_28;
  iterator it;
  string *name_local;
  TargetType type_local;
  cmMakefile *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               )name;
  cmTarget::cmTarget(&local_3e8,name,type,VisibilityNormal,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  ::pair<cmTarget,_true>(&local_220,name,&local_3e8);
  pVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
          ::insert(&this->Targets,&local_220);
  local_408._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
       ._M_cur;
  local_400 = pVar2.second;
  local_38._M_cur = local_408._M_cur;
  local_30 = local_400;
  local_28._M_cur = local_408._M_cur;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  ::~pair(&local_220);
  cmTarget::~cmTarget(&local_3e8);
  this_00 = GetGlobalGenerator(this);
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                         *)&local_28);
  cmGlobalGenerator::IndexTarget(this_00,&ppVar1->second);
  GetStateSnapshot(&local_448,this);
  cmStateSnapshot::GetDirectory(&local_430,&local_448);
  cmStateDirectory::AddNormalTargetName
            (&local_430,
             (string *)
             it.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             ._M_cur);
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                         *)&local_28);
  return &ppVar1->second;
}

Assistant:

cmTarget* cmMakefile::AddNewTarget(cmStateEnums::TargetType type,
                                   const std::string& name)
{
  cmTargets::iterator it =
    this->Targets
      .insert(cmTargets::value_type(
        name, cmTarget(name, type, cmTarget::VisibilityNormal, this)))
      .first;
  this->GetGlobalGenerator()->IndexTarget(&it->second);
  this->GetStateSnapshot().GetDirectory().AddNormalTargetName(name);
  return &it->second;
}